

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O0

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::PassRegistry::createPass(PassRegistry *this,string *name)

{
  bool bVar1;
  Fatal *pFVar2;
  mapped_type *pmVar3;
  Pass *__p;
  pointer pPVar4;
  key_type *in_RDX;
  Fatal local_1b8;
  _Self local_30;
  _Self local_28 [2];
  string *name_local;
  PassRegistry *this_local;
  unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *ret;
  
  name_local = name;
  this_local = this;
  local_28[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo>_>_>
               *)name,in_RDX);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo>_>_>
              *)name);
  bVar1 = std::operator==(local_28,&local_30);
  if (bVar1) {
    Fatal::Fatal(&local_1b8);
    pFVar2 = Fatal::operator<<(&local_1b8,(char (*) [22])"Could not find pass: ");
    pFVar2 = Fatal::operator<<(pFVar2,in_RDX);
    Fatal::operator<<(pFVar2,(char (*) [2])0x214c2d7);
    Fatal::~Fatal(&local_1b8);
  }
  std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>::
  unique_ptr<std::default_delete<wasm::Pass>,void>
            ((unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>> *)this);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo>_>_>
                         *)name,in_RDX);
  __p = std::function<wasm::Pass_*()>::operator()(&pmVar3->create);
  std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>::reset
            ((unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)this,__p);
  pPVar4 = std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>::operator->
                     ((unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)this);
  std::__cxx11::string::operator=((string *)&pPVar4->name,(string *)in_RDX);
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> PassRegistry::createPass(std::string name) {
  if (passInfos.find(name) == passInfos.end()) {
    Fatal() << "Could not find pass: " << name << "\n";
  }
  std::unique_ptr<Pass> ret;
  ret.reset(passInfos[name].create());
  ret->name = name;
  return ret;
}